

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
OneLevel_InsertSecondNode_Test::~OneLevel_InsertSecondNode_Test
          (OneLevel_InsertSecondNode_Test *this)

{
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__OneLevel_00273730;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_OneLevel).index_);
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_00273670;
  pstore::database::~database
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_);
  in_memory_store::~in_memory_store
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (OneLevel, InsertSecondNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "b");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("b", key);
    EXPECT_TRUE (itp.second);
    EXPECT_EQ (2U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "b")) << "key \"b\" should be present in the index";
    {
        // Check that the root is in heap as we expected.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b1010U);
        this->check_is_leaf_node ((*root_internal)[0]);
        this->check_is_leaf_node ((*root_internal)[1]);
        EXPECT_GT ((*root_internal)[0].to_address (), (*root_internal)[1].to_address ());
        index_->flush (t1, db_.get_current_revision ());
        EXPECT_NE (root, index_->root ());
        this->check_is_store_internal_node (index_->root ());
    }
}